

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWO2File(LWOImporter *this)

{
  list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *this_00;
  bool bVar1;
  bool bVar2;
  uint16_t uVar3;
  DeadlyImportError *pDVar4;
  ulong uVar5;
  long lVar6;
  Logger *pLVar7;
  size_type sVar8;
  float fVar9;
  uint old_1;
  uint old;
  char buffer [128];
  string local_1f0;
  reference local_1d0;
  Layer *layer;
  uint8_t *local_70;
  uint8_t *next;
  allocator<char> local_51;
  string local_50;
  ChunkHeader local_2c;
  ChunkHeader head;
  uint iUnnamed;
  uint8_t *end;
  bool skip;
  LWOImporter *this_local;
  
  bVar1 = false;
  register0x00000000 = this->mFileBuffer + this->fileSize;
  head.type = 0;
  do {
    while( true ) {
      if (stack0xffffffffffffffe0 < this->mFileBuffer + 8) {
        return;
      }
      local_2c = IFF::LoadChunk(&this->mFileBuffer);
      if (stack0xffffffffffffffe0 < this->mFileBuffer + local_2c.length) {
        next._3_1_ = 1;
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"LWO2: Chunk length points behind the file",&local_51);
        DeadlyImportError::DeadlyImportError(pDVar4,&local_50);
        next._3_1_ = 0;
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      local_70 = this->mFileBuffer + local_2c.length;
      if (local_2c.length != 0) break;
      this->mFileBuffer = local_70;
    }
    if (local_2c.type == 0x434c4950) {
      LoadLWO2Clip(this,local_2c.length);
    }
    else if (local_2c.type == 0x454e564c) {
      LoadLWO2Envelope(this,local_2c.length);
    }
    else if (local_2c.type == 0x4c415952) {
      this_00 = this->mLayers;
      LWO::Layer::Layer((Layer *)&layer);
      std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::push_back
                (this_00,(Layer *)&layer);
      LWO::Layer::~Layer((Layer *)&layer);
      local_1d0 = std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::back
                            (this->mLayers);
      this->mCurLayer = local_1d0;
      if (local_2c.length < 0x10) {
        buffer[0x7e] = '\x01';
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,"LWO: LAYR chunk is too small",
                   (allocator<char> *)(buffer + 0x7f));
        DeadlyImportError::DeadlyImportError(pDVar4,&local_1f0);
        buffer[0x7e] = '\0';
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      uVar3 = GetU2(this);
      local_1d0->mIndex = uVar3;
      if ((this->configLayerIndex == 0xffffffff) ||
         (this->configLayerIndex - 1 == (uint)local_1d0->mIndex)) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
      this->mFileBuffer = this->mFileBuffer + 2;
      fVar9 = GetF4(this);
      (this->mCurLayer->mPivot).x = fVar9;
      fVar9 = GetF4(this);
      (this->mCurLayer->mPivot).y = fVar9;
      fVar9 = GetF4(this);
      (this->mCurLayer->mPivot).z = fVar9;
      GetS0(this,&local_1d0->mName,local_2c.length - 0x10);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) != 0) {
        head.type = head.type + 1;
        snprintf((char *)&old_1,0x80,"Layer_%i");
        std::__cxx11::string::operator=((string *)&local_1d0->mName,(char *)&old_1);
      }
      lVar6 = std::__cxx11::string::length();
      if ((lVar6 == 0) ||
         (bVar2 = std::operator!=(&this->configLayerName,&local_1d0->mName), !bVar2)) {
        this->hasNamedLayer = true;
      }
      else {
        bVar1 = true;
      }
      if (local_70 < this->mFileBuffer + 2) {
        local_1d0->mParent = 0xffff;
      }
      else {
        uVar3 = GetU2(this);
        local_1d0->mParent = uVar3;
      }
      local_1d0->skip = bVar1;
    }
    else if (local_2c.type == 0x504e5453) {
      if (bVar1 == false) {
        sVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          (&this->mCurLayer->mTempPoints);
        LoadLWOPoints(this,local_2c.length);
        this->mCurLayer->mPointIDXOfs = (uint)sVar8;
      }
    }
    else if (local_2c.type == 0x504f4c53) {
      if (bVar1 == false) {
        sVar8 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::size
                          (&this->mCurLayer->mFaces);
        LoadLWO2Polygons(this,local_2c.length);
        this->mCurLayer->mFaceIDXOfs = (uint)sVar8;
      }
    }
    else if (local_2c.type == 0x50544147) {
      if (bVar1 == false) {
        bVar2 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::empty
                          (&this->mCurLayer->mFaces);
        if (bVar2) {
          pLVar7 = DefaultLogger::get();
          Logger::warn(pLVar7,"LWO2: Unexpected PTAG");
        }
        else {
          LoadLWO2PolygonTags(this,local_2c.length);
        }
      }
    }
    else if (local_2c.type == 0x53555246) {
      LoadLWO2Surface(this,local_2c.length);
    }
    else if (local_2c.type == 0x54414753) {
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(this->mTags);
      if (bVar2) {
        LoadLWOTags(this,local_2c.length);
      }
      else {
        pLVar7 = DefaultLogger::get();
        Logger::warn(pLVar7,"LWO2: SRFS chunk encountered twice");
      }
    }
    else if (local_2c.type == 0x564d4144) {
      bVar2 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::empty
                        (&this->mCurLayer->mFaces);
      if (!bVar2) goto LAB_0052e4c9;
      pLVar7 = DefaultLogger::get();
      Logger::warn(pLVar7,"LWO2: Unexpected VMAD chunk");
    }
    else if (local_2c.type == 0x564d4150) {
LAB_0052e4c9:
      if (bVar1 == false) {
        bVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                          (&this->mCurLayer->mTempPoints);
        if (bVar2) {
          pLVar7 = DefaultLogger::get();
          Logger::warn(pLVar7,"LWO2: Unexpected VMAP chunk");
        }
        else {
          LoadLWO2VertexMap(this,local_2c.length,local_2c.type == 0x564d4144);
        }
      }
    }
    this->mFileBuffer = local_70;
  } while( true );
}

Assistant:

void LWOImporter::LoadLWO2File()
{
    bool skip = false;

    LE_NCONST uint8_t* const end = mFileBuffer + fileSize;
    unsigned int iUnnamed = 0;
    while (true)
    {
        if (mFileBuffer + sizeof(IFF::ChunkHeader) > end)break;
        const IFF::ChunkHeader head = IFF::LoadChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
        {
            throw DeadlyImportError("LWO2: Chunk length points behind the file");
            break;
        }
        uint8_t* const next = mFileBuffer+head.length;

        if(!head.length) {
            mFileBuffer = next;
            continue;
        }

        switch (head.type)
        {
            // new layer
        case AI_LWO_LAYR:
            {
                // add a new layer to the list ....
                mLayers->push_back ( LWO::Layer() );
                LWO::Layer& layer = mLayers->back();
                mCurLayer = &layer;

                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,LAYR,16);

                // layer index.
                layer.mIndex = GetU2();

                // Continue loading this layer or ignore it? Check the layer index property
                if (UINT_MAX != configLayerIndex && (configLayerIndex-1) != layer.mIndex)   {
                    skip = true;
                }
                else skip = false;

                // pivot point
                mFileBuffer += 2; /* unknown */
                mCurLayer->mPivot.x = GetF4();
                mCurLayer->mPivot.y = GetF4();
                mCurLayer->mPivot.z = GetF4();
                GetS0(layer.mName,head.length-16);

                // if the name is empty, generate a default name
                if (layer.mName.empty())    {
                    char buffer[128]; // should be sufficiently large
                    ::ai_snprintf(buffer, 128, "Layer_%i", iUnnamed++);
                    layer.mName = buffer;
                }

                // load this layer or ignore it? Check the layer name property
                if (configLayerName.length() && configLayerName != layer.mName) {
                    skip = true;
                }
                else hasNamedLayer = true;

                // optional: parent of this layer
                if (mFileBuffer + 2 <= next)
                    layer.mParent = GetU2();
                else layer.mParent = -1;

                // Set layer skip parameter
                layer.skip = skip;

                break;
            }

            // vertex list
        case AI_LWO_PNTS:
            {
                if (skip)
                    break;

                unsigned int old = (unsigned int)mCurLayer->mTempPoints.size();
                LoadLWOPoints(head.length);
                mCurLayer->mPointIDXOfs = old;
                break;
            }
            // vertex tags
        case AI_LWO_VMAD:
            if (mCurLayer->mFaces.empty())
            {
                ASSIMP_LOG_WARN("LWO2: Unexpected VMAD chunk");
                break;
            }
            // --- intentionally no break here
        case AI_LWO_VMAP:
            {
                if (skip)
                    break;

                if (mCurLayer->mTempPoints.empty())
                    ASSIMP_LOG_WARN("LWO2: Unexpected VMAP chunk");
                else LoadLWO2VertexMap(head.length,head.type == AI_LWO_VMAD);
                break;
            }
            // face list
        case AI_LWO_POLS:
            {
                if (skip)
                    break;

                unsigned int old = (unsigned int)mCurLayer->mFaces.size();
                LoadLWO2Polygons(head.length);
                mCurLayer->mFaceIDXOfs = old;
                break;
            }
            // polygon tags
        case AI_LWO_PTAG:
            {
                if (skip)
                    break;

                if (mCurLayer->mFaces.empty()) {
                    ASSIMP_LOG_WARN("LWO2: Unexpected PTAG");
                } else {
                    LoadLWO2PolygonTags(head.length);
                }
                break;
            }
            // list of tags
        case AI_LWO_TAGS:
            {
                if (!mTags->empty()) {
                    ASSIMP_LOG_WARN("LWO2: SRFS chunk encountered twice");
                }   else {
                    LoadLWOTags(head.length);
                }
                break;
            }

            // surface chunk
        case AI_LWO_SURF:
            {
                LoadLWO2Surface(head.length);
                break;
            }

            // clip chunk
        case AI_LWO_CLIP:
            {
                LoadLWO2Clip(head.length);
                break;
            }

            // envelope chunk
        case AI_LWO_ENVL:
            {
                LoadLWO2Envelope(head.length);
                break;
            }
        }
        mFileBuffer = next;
    }
}